

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O0

void __thiscall CoinSelection_ConvertToUtxo_Test::TestBody(CoinSelection_ConvertToUtxo_Test *this)

{
  pointer *ppSVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  Amount AVar5;
  AssertionResult gtest_ar_23;
  AssertionResult gtest_ar_22;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  ConfidentialAssetId asset;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  CfdException *except;
  Utxo utxo;
  void *binary_data;
  Amount amount;
  string output_descriptor;
  Script locking_script;
  uint32_t vout;
  Txid txid;
  BlockHash block_hash;
  uint64_t block_height;
  Script *this_01;
  Script *lhs;
  Script *this_02;
  char *in_stack_fffffffffffff288;
  undefined7 in_stack_fffffffffffff298;
  undefined1 in_stack_fffffffffffff29f;
  uchar *in_stack_fffffffffffff2a0;
  uchar *in_stack_fffffffffffff2a8;
  uchar (*__arr) [33];
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffff2b0;
  string *in_stack_fffffffffffff2d8;
  undefined7 in_stack_fffffffffffff2e0;
  undefined1 in_stack_fffffffffffff2e7;
  undefined8 in_stack_fffffffffffff2e8;
  uint32_t vout_00;
  Txid *in_stack_fffffffffffff2f0;
  BlockHash *in_stack_fffffffffffff2f8;
  undefined7 in_stack_fffffffffffff300;
  undefined1 in_stack_fffffffffffff307;
  undefined7 in_stack_fffffffffffff320;
  undefined1 in_stack_fffffffffffff327;
  ConfidentialAssetId *in_stack_fffffffffffff328;
  undefined7 in_stack_fffffffffffff330;
  undefined1 in_stack_fffffffffffff337;
  Utxo *in_stack_fffffffffffff338;
  Script *in_stack_fffffffffffff340;
  AssertHelper local_a28;
  Message local_a20;
  string local_a18;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_9f0;
  ByteData local_9d8;
  ConfidentialAssetId local_9c0;
  string local_998;
  AssertionResult local_978;
  AssertHelper local_968;
  Message local_960;
  AssertionResult local_958;
  AssertHelper local_948;
  Message local_940;
  int64_t local_938;
  AssertionResult local_930;
  AssertHelper local_920;
  Message local_918;
  undefined2 local_90a;
  AssertionResult local_908;
  AssertHelper local_8f8;
  Message local_8f0;
  undefined2 local_8e2;
  AssertionResult local_8e0;
  AssertHelper local_8d0;
  Message local_8c8;
  undefined2 local_8ba;
  AssertionResult local_8b8;
  AssertHelper local_8a8;
  Message local_8a0;
  ByteData local_898;
  size_t local_880;
  AssertionResult local_878;
  AssertHelper local_868;
  Message local_860;
  AssertionResult local_858;
  AssertHelper local_848;
  Message local_840;
  string local_838 [16];
  undefined8 in_stack_fffffffffffff7d8;
  undefined8 in_stack_fffffffffffff7e0;
  uint32_t in_stack_fffffffffffff7ec;
  Txid *in_stack_fffffffffffff7f0;
  BlockHash *in_stack_fffffffffffff7f8;
  pointer in_stack_fffffffffffff800;
  Amount *in_stack_fffffffffffff810;
  pointer in_stack_fffffffffffff818;
  Utxo *in_stack_fffffffffffff820;
  Script *in_stack_fffffffffffff828;
  string local_7c0;
  AssertionResult local_7a0;
  AssertHelper local_790;
  Message local_788;
  string local_780;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_758;
  ByteData256 local_740;
  BlockHash local_728;
  string local_708;
  AssertionResult local_6e8;
  AssertHelper local_6d8;
  Message local_6d0;
  AssertionResult local_6c8;
  AssertHelper local_6b8;
  Message local_6b0;
  string local_6a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_680;
  ByteData local_668;
  string local_650;
  AssertionResult local_630;
  AssertHelper local_620;
  Message local_618;
  allocator local_609;
  string local_608;
  Script local_5e8;
  AssertionResult local_5b0;
  AssertHelper local_5a0;
  Message local_598;
  int64_t local_590;
  AssertionResult local_588;
  AssertHelper local_578;
  Message local_570;
  undefined2 local_562;
  AssertionResult local_560;
  AssertHelper local_550;
  Message local_548;
  undefined2 local_53a;
  AssertionResult local_538;
  AssertHelper local_528;
  Message local_520;
  undefined2 local_512;
  AssertionResult local_510;
  AssertHelper local_500;
  Message local_4f8;
  ByteData local_4f0;
  size_t local_4d8;
  AssertionResult local_4d0;
  AssertHelper local_4c0;
  Message local_4b8;
  AssertionResult local_4b0;
  AssertHelper local_4a0;
  Message local_498;
  string local_490;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_468;
  ByteData256 local_450;
  Txid local_438;
  string local_418;
  AssertionResult local_3f8;
  AssertHelper local_3e8;
  Message local_3e0;
  string local_3d8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_3b0;
  ByteData256 local_398;
  BlockHash local_380;
  string local_360;
  AssertionResult local_340;
  AssertHelper local_330;
  Message local_328;
  AssertionResult local_320;
  AssertHelper local_310;
  Message local_308;
  string local_300;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2d8;
  ByteData local_2c0;
  string local_2a8;
  AssertionResult local_288;
  AssertHelper local_278;
  Message local_270 [7];
  Script local_238;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  Script *local_160;
  int64_t local_158;
  undefined1 local_150;
  Amount local_148;
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108;
  Script local_e8;
  undefined1 local_b0 [8];
  string local_a8;
  Txid local_88;
  allocator local_51;
  string local_50;
  BlockHash local_30;
  undefined8 local_10;
  
  vout_00 = (uint32_t)((ulong)in_stack_fffffffffffff2e8 >> 0x20);
  local_10 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_50,"1234567890123456789012345678901234567890123456789012345678901456",
             &local_51);
  cfd::core::BlockHash::BlockHash(&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a8,"0034567890123456789012345678901234567890123456789012345678901456",
             (allocator *)(local_b0 + 7));
  cfd::core::Txid::Txid(&local_88,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)(local_b0 + 7));
  local_b0._0_4_ = 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_108,"0014c59664568fad58004e1fac1b275826d8b525e935",&local_109);
  cfd::core::Script::Script(&local_e8,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_130,
             "wpkh([ef735203/0\'/0\'/7\']022c2409fbf657ba25d97bb3dab5426d20677b774d4fc7bd3bfac27ff96ada3dd1)"
             ,&local_131);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  AVar5 = cfd::core::Amount::CreateBySatoshiAmount(20000);
  local_158 = AVar5.amount_;
  local_150 = AVar5.ignore_check_;
  this_01 = (Script *)local_b0;
  local_178 = 0;
  uStack_170 = 0;
  local_188 = 0;
  uStack_180 = 0;
  local_198 = 0;
  uStack_190 = 0;
  local_1a8 = 0;
  uStack_1a0 = 0;
  local_1b8 = 0;
  uStack_1b0 = 0;
  local_1c8 = 0;
  uStack_1c0 = 0;
  local_1d8 = 0;
  uStack_1d0 = 0;
  local_1e8 = 0;
  uStack_1e0 = 0;
  local_1f8 = 0;
  uStack_1f0 = 0;
  local_238.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_200 = 0;
  local_238.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238._vptr_Script = (_func_int **)0x0;
  local_238.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168 = 0;
  lhs = &local_238;
  this_02 = (Script *)0x0;
  local_160 = this_01;
  local_148.amount_ = local_158;
  local_148.ignore_check_ = (bool)local_150;
  cfd::CoinSelection::ConvertToUtxo
            ((uint64_t)in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0
             ,in_stack_fffffffffffff7ec,(Script *)in_stack_fffffffffffff7e0,
             (string *)in_stack_fffffffffffff7d8,in_stack_fffffffffffff810,in_stack_fffffffffffff818
             ,in_stack_fffffffffffff820,in_stack_fffffffffffff828);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      lhs = &local_238;
      this_02 = (Script *)0x0;
      this_01 = local_160;
      cfd::CoinSelection::ConvertToUtxo
                ((uint64_t)in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,
                 in_stack_fffffffffffff7f0,in_stack_fffffffffffff7ec,
                 (Script *)in_stack_fffffffffffff7e0,(string *)in_stack_fffffffffffff7d8,
                 in_stack_fffffffffffff810,in_stack_fffffffffffff818,in_stack_fffffffffffff820,
                 in_stack_fffffffffffff828);
    }
  }
  else {
    testing::Message::Message(local_270);
    testing::internal::AssertHelper::AssertHelper
              (&local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x295,
               "Expected: (CoinSelection::ConvertToUtxo( block_height, block_hash, txid, vout, locking_script, output_descriptor, amount, binary_data, &utxo)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_278,local_270);
    testing::internal::AssertHelper::~AssertHelper(&local_278);
    testing::Message::~Message((Message *)0x266f4a);
  }
  if (local_1c8._4_2_ != 0) {
    std::begin<unsigned_char,40ul>((uchar (*) [40])((long)&uStack_1f0 + 4));
    std::begin<unsigned_char,40ul>((uchar (*) [40])((long)&uStack_1f0 + 4));
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x266ff8);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
              (in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8,in_stack_fffffffffffff2a0,
               (allocator_type *)CONCAT17(in_stack_fffffffffffff29f,in_stack_fffffffffffff298));
    cfd::core::ByteData::ByteData(&local_2c0,&local_2d8);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_2a8,&local_2c0);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cfd::core::Script::GetHex_abi_cxx11_(&local_300,&local_e8);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_288,
               "ByteData(std::vector<uint8_t>(std::begin(utxo.locking_script), std::begin(utxo.locking_script) + utxo.script_length)).GetHex().c_str()"
               ,"locking_script.GetHex().c_str()",pcVar3,pcVar4);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_2a8);
    cfd::core::ByteData::~ByteData((ByteData *)0x2670d5);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_02);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x2670ef);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_288);
    if (!bVar2) {
      testing::Message::Message(&local_308);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x267204);
      testing::internal::AssertHelper::AssertHelper
                (&local_310,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x29a,pcVar3);
      testing::internal::AssertHelper::operator=(&local_310,&local_308);
      testing::internal::AssertHelper::~AssertHelper(&local_310);
      testing::Message::~Message((Message *)0x267267);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2672bc);
  }
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            (in_stack_fffffffffffff288,(char *)this_02,(unsigned_long *)lhs,(unsigned_long *)this_01
            );
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_320);
  if (!bVar2) {
    testing::Message::Message(&local_328);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x26735a);
    testing::internal::AssertHelper::AssertHelper
              (&local_330,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x29c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_330,&local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_330);
    testing::Message::~Message((Message *)0x2673bd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x267415);
  std::begin<unsigned_char,32ul>((uchar (*) [32])&local_238.script_data_);
  std::end<unsigned_char,32ul>((uchar (*) [32])&local_238.script_data_);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x26745c);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
            (in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8,in_stack_fffffffffffff2a0,
             (allocator_type *)CONCAT17(in_stack_fffffffffffff29f,in_stack_fffffffffffff298));
  cfd::core::ByteData256::ByteData256(&local_398,&local_3b0);
  cfd::core::BlockHash::BlockHash(&local_380,&local_398);
  cfd::core::BlockHash::GetHex_abi_cxx11_(&local_360,&local_380);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cfd::core::BlockHash::GetHex_abi_cxx11_(&local_3d8,&local_30);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_340,
             "BlockHash(ByteData256(std::vector<uint8_t>(std::begin(utxo.block_hash), std::end(utxo.block_hash)))).GetHex().c_str()"
             ,"block_hash.GetHex().c_str()",pcVar3,pcVar4);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__cxx11::string::~string((string *)&local_360);
  cfd::core::BlockHash::~BlockHash((BlockHash *)0x267550);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)0x26755d);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_02);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x267577);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_340);
  if (!bVar2) {
    testing::Message::Message(&local_3e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2676c4);
    testing::internal::AssertHelper::AssertHelper
              (&local_3e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x29d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3e8,&local_3e0);
    testing::internal::AssertHelper::~AssertHelper(&local_3e8);
    testing::Message::~Message((Message *)0x267727);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x26777f);
  ppSVar1 = &local_238.script_stack_.
             super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  std::begin<unsigned_char,32ul>((uchar (*) [32])ppSVar1);
  std::end<unsigned_char,32ul>((uchar (*) [32])ppSVar1);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x2677c6);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
            (in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8,in_stack_fffffffffffff2a0,
             (allocator_type *)CONCAT17(in_stack_fffffffffffff29f,in_stack_fffffffffffff298));
  cfd::core::ByteData256::ByteData256(&local_450,&local_468);
  cfd::core::Txid::Txid(&local_438,&local_450);
  cfd::core::Txid::GetHex_abi_cxx11_(&local_418,&local_438);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cfd::core::Txid::GetHex_abi_cxx11_(&local_490,&local_88);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3f8,
             "Txid(ByteData256(std::vector<uint8_t>(std::begin(utxo.txid), std::end(utxo.txid)))).GetHex().c_str()"
             ,"txid.GetHex().c_str()",pcVar3,pcVar4);
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::~string((string *)&local_418);
  cfd::core::Txid::~Txid((Txid *)0x2678ba);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)0x2678c7);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_02);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x2678e1);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_3f8);
  if (!bVar2) {
    testing::Message::Message(&local_498);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x267a2e);
    testing::internal::AssertHelper::AssertHelper
              (&local_4a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x29e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_4a0,&local_498);
    testing::internal::AssertHelper::~AssertHelper(&local_4a0);
    testing::Message::~Message((Message *)0x267a91);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x267ae6);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            (in_stack_fffffffffffff288,(char *)this_02,(uint *)lhs,(uint *)this_01);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_4b0);
  if (!bVar2) {
    testing::Message::Message(&local_4b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x267b82);
    testing::internal::AssertHelper::AssertHelper
              (&local_4c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x29f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_4c0,&local_4b8);
    testing::internal::AssertHelper::~AssertHelper(&local_4c0);
    testing::Message::~Message((Message *)0x267be5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x267c3d);
  cfd::core::Script::GetData(&local_4f0,&local_e8);
  local_4d8 = cfd::core::ByteData::GetDataSize(&local_4f0);
  testing::internal::EqHelper<false>::Compare<unsigned_short,unsigned_long>
            (in_stack_fffffffffffff288,(char *)this_02,(unsigned_short *)lhs,
             (unsigned_long *)this_01);
  cfd::core::ByteData::~ByteData((ByteData *)0x267cc5);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_4d0);
  if (!bVar2) {
    testing::Message::Message(&local_4f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x267d5a);
    testing::internal::AssertHelper::AssertHelper
              (&local_500,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2a0,pcVar3);
    testing::internal::AssertHelper::operator=(&local_500,&local_4f8);
    testing::internal::AssertHelper::~AssertHelper(&local_500);
    testing::Message::~Message((Message *)0x267dbd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x267e12);
  local_512 = 4;
  testing::internal::EqHelper<false>::Compare<unsigned_short,unsigned_short>
            (in_stack_fffffffffffff288,(char *)this_02,(unsigned_short *)lhs,
             (unsigned_short *)this_01);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_510);
  if (!bVar2) {
    testing::Message::Message(&local_520);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x267eb8);
    testing::internal::AssertHelper::AssertHelper
              (&local_528,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2a1,pcVar3);
    testing::internal::AssertHelper::operator=(&local_528,&local_520);
    testing::internal::AssertHelper::~AssertHelper(&local_528);
    testing::Message::~Message((Message *)0x267f1b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x267f70);
  local_53a = 0x6d;
  testing::internal::EqHelper<false>::Compare<unsigned_short,unsigned_short>
            (in_stack_fffffffffffff288,(char *)this_02,(unsigned_short *)lhs,
             (unsigned_short *)this_01);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_538);
  if (!bVar2) {
    testing::Message::Message(&local_548);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x268016);
    testing::internal::AssertHelper::AssertHelper
              (&local_550,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2a2,pcVar3);
    testing::internal::AssertHelper::operator=(&local_550,&local_548);
    testing::internal::AssertHelper::~AssertHelper(&local_550);
    testing::Message::~Message((Message *)0x268079);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2680ce);
  local_562 = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_short,unsigned_short>
            (in_stack_fffffffffffff288,(char *)this_02,(unsigned_short *)lhs,
             (unsigned_short *)this_01);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_560);
  if (!bVar2) {
    testing::Message::Message(&local_570);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x268174);
    testing::internal::AssertHelper::AssertHelper
              (&local_578,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2a3,pcVar3);
    testing::internal::AssertHelper::operator=(&local_578,&local_570);
    testing::internal::AssertHelper::~AssertHelper(&local_578);
    testing::Message::~Message((Message *)0x2681d7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x26822f);
  local_590 = cfd::core::Amount::GetSatoshiValue(&local_148);
  testing::internal::EqHelper<false>::Compare<unsigned_long,long>
            (in_stack_fffffffffffff288,(char *)this_02,(unsigned_long *)lhs,(long *)this_01);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_588);
  if (!bVar2) {
    testing::Message::Message(&local_598);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x268302);
    testing::internal::AssertHelper::AssertHelper
              (&local_5a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2a4,pcVar3);
    testing::internal::AssertHelper::operator=(&local_5a0,&local_598);
    testing::internal::AssertHelper::~AssertHelper(&local_5a0);
    testing::Message::~Message((Message *)0x268365);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2683ba);
  testing::internal::EqHelper<false>::Compare<void*,void*>
            (in_stack_fffffffffffff288,(char *)this_02,&lhs->_vptr_Script,&this_01->_vptr_Script);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_5b0);
  if (!bVar2) {
    testing::Message::Message
              ((Message *)
               &local_5e8.script_stack_.
                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x268456);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &local_5e8.script_stack_.
                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                ._M_impl.super__Vector_impl_data._M_finish,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2a5,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &local_5e8.script_stack_.
                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                ._M_impl.super__Vector_impl_data._M_finish,
               (Message *)
               &local_5e8.script_stack_.
                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &local_5e8.script_stack_.
                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                ._M_impl.super__Vector_impl_data._M_finish);
    testing::Message::~Message((Message *)0x2684b9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x268511);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_608,"9934567890123456789012345678901234567890123456789012345678901456"
             ,&local_609);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)&local_5e8,&local_608);
  std::__cxx11::string::~string((string *)&local_608);
  std::allocator<char>::~allocator((allocator<char> *)&local_609);
  local_178 = 0;
  uStack_170 = 0;
  local_188 = 0;
  uStack_180 = 0;
  local_198 = 0;
  uStack_190 = 0;
  local_1a8 = 0;
  uStack_1a0 = 0;
  local_1b8 = 0;
  uStack_1b0 = 0;
  local_1c8 = 0;
  uStack_1c0 = 0;
  local_1d8 = 0;
  uStack_1d0 = 0;
  local_1e8 = 0;
  uStack_1e0 = 0;
  local_1f8 = 0;
  uStack_1f0 = 0;
  local_238.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_200 = 0;
  local_238.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238._vptr_Script = (_func_int **)0x0;
  local_238.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168 = 0;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      this_02 = &local_238;
      this_01 = &local_5e8;
      in_stack_fffffffffffff288 = (char *)0x0;
      lhs = local_160;
      cfd::CoinSelection::ConvertToUtxo
                (CONCAT17(in_stack_fffffffffffff307,in_stack_fffffffffffff300),
                 in_stack_fffffffffffff2f8,in_stack_fffffffffffff2f0,vout_00,
                 (Script *)CONCAT17(in_stack_fffffffffffff2e7,in_stack_fffffffffffff2e0),
                 in_stack_fffffffffffff2d8,
                 (Amount *)CONCAT17(in_stack_fffffffffffff327,in_stack_fffffffffffff320),
                 in_stack_fffffffffffff328,
                 (void *)CONCAT17(in_stack_fffffffffffff337,in_stack_fffffffffffff330),
                 in_stack_fffffffffffff338,in_stack_fffffffffffff340);
    }
  }
  else {
    testing::Message::Message(&local_618);
    testing::internal::AssertHelper::AssertHelper
              (&local_620,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2ac,
               "Expected: (CoinSelection::ConvertToUtxo( block_height, block_hash, txid, vout, locking_script, output_descriptor, amount, asset, binary_data, &utxo)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_620,&local_618);
    testing::internal::AssertHelper::~AssertHelper(&local_620);
    testing::Message::~Message((Message *)0x2687be);
  }
  if (local_1c8._4_2_ != 0) {
    std::begin<unsigned_char,40ul>((uchar (*) [40])((long)&uStack_1f0 + 4));
    std::begin<unsigned_char,40ul>((uchar (*) [40])((long)&uStack_1f0 + 4));
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x26886c);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
              (in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8,in_stack_fffffffffffff2a0,
               (allocator_type *)CONCAT17(in_stack_fffffffffffff29f,in_stack_fffffffffffff298));
    cfd::core::ByteData::ByteData(&local_668,&local_680);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_650,&local_668);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cfd::core::Script::GetHex_abi_cxx11_(&local_6a8,&local_e8);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_630,
               "ByteData(std::vector<uint8_t>(std::begin(utxo.locking_script), std::begin(utxo.locking_script) + utxo.script_length)).GetHex().c_str()"
               ,"locking_script.GetHex().c_str()",pcVar3,pcVar4);
    std::__cxx11::string::~string((string *)&local_6a8);
    std::__cxx11::string::~string((string *)&local_650);
    cfd::core::ByteData::~ByteData((ByteData *)0x268949);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_02);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x268963);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_630);
    if (!bVar2) {
      testing::Message::Message(&local_6b0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x268a78);
      testing::internal::AssertHelper::AssertHelper
                (&local_6b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x2b1,pcVar3);
      testing::internal::AssertHelper::operator=(&local_6b8,&local_6b0);
      testing::internal::AssertHelper::~AssertHelper(&local_6b8);
      testing::Message::~Message((Message *)0x268adb);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x268b30);
  }
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            (in_stack_fffffffffffff288,(char *)this_02,(unsigned_long *)lhs,(unsigned_long *)this_01
            );
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_6c8);
  if (!bVar2) {
    testing::Message::Message(&local_6d0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x268bce);
    testing::internal::AssertHelper::AssertHelper
              (&local_6d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2b3,pcVar3);
    testing::internal::AssertHelper::operator=(&local_6d8,&local_6d0);
    testing::internal::AssertHelper::~AssertHelper(&local_6d8);
    testing::Message::~Message((Message *)0x268c31);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x268c89);
  std::begin<unsigned_char,32ul>((uchar (*) [32])&local_238.script_data_);
  std::end<unsigned_char,32ul>((uchar (*) [32])&local_238.script_data_);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x268cd0);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
            (in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8,in_stack_fffffffffffff2a0,
             (allocator_type *)CONCAT17(in_stack_fffffffffffff29f,in_stack_fffffffffffff298));
  cfd::core::ByteData256::ByteData256(&local_740,&local_758);
  cfd::core::BlockHash::BlockHash(&local_728,&local_740);
  cfd::core::BlockHash::GetHex_abi_cxx11_(&local_708,&local_728);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cfd::core::BlockHash::GetHex_abi_cxx11_(&local_780,&local_30);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_6e8,
             "BlockHash(ByteData256(std::vector<uint8_t>(std::begin(utxo.block_hash), std::end(utxo.block_hash)))).GetHex().c_str()"
             ,"block_hash.GetHex().c_str()",pcVar3,pcVar4);
  std::__cxx11::string::~string((string *)&local_780);
  std::__cxx11::string::~string((string *)&local_708);
  cfd::core::BlockHash::~BlockHash((BlockHash *)0x268dc4);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)0x268dd1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_02);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x268deb);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_6e8);
  if (!bVar2) {
    testing::Message::Message(&local_788);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x268f38);
    testing::internal::AssertHelper::AssertHelper
              (&local_790,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2b4,pcVar3);
    testing::internal::AssertHelper::operator=(&local_790,&local_788);
    testing::internal::AssertHelper::~AssertHelper(&local_790);
    testing::Message::~Message((Message *)0x268f9b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x268ff3);
  ppSVar1 = &local_238.script_stack_.
             super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  std::begin<unsigned_char,32ul>((uchar (*) [32])ppSVar1);
  std::end<unsigned_char,32ul>((uchar (*) [32])ppSVar1);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x26903a);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
            (in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8,in_stack_fffffffffffff2a0,
             (allocator_type *)CONCAT17(in_stack_fffffffffffff29f,in_stack_fffffffffffff298));
  cfd::core::ByteData256::ByteData256
            ((ByteData256 *)&stack0xfffffffffffff808,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xfffffffffffff7f0);
  cfd::core::Txid::Txid((Txid *)&stack0xfffffffffffff820,(ByteData256 *)&stack0xfffffffffffff808);
  cfd::core::Txid::GetHex_abi_cxx11_(&local_7c0,(Txid *)&stack0xfffffffffffff820);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cfd::core::Txid::GetHex_abi_cxx11_((string *)local_838,&local_88);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_7a0,
             "Txid(ByteData256(std::vector<uint8_t>(std::begin(utxo.txid), std::end(utxo.txid)))).GetHex().c_str()"
             ,"txid.GetHex().c_str()",pcVar3,pcVar4);
  std::__cxx11::string::~string(local_838);
  std::__cxx11::string::~string((string *)&local_7c0);
  cfd::core::Txid::~Txid((Txid *)0x26912e);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)0x26913b);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_02);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x269155);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_7a0);
  if (!bVar2) {
    testing::Message::Message(&local_840);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2692a2);
    testing::internal::AssertHelper::AssertHelper
              (&local_848,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2b5,pcVar3);
    testing::internal::AssertHelper::operator=(&local_848,&local_840);
    testing::internal::AssertHelper::~AssertHelper(&local_848);
    testing::Message::~Message((Message *)0x269305);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x26935a);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            (in_stack_fffffffffffff288,(char *)this_02,(uint *)lhs,(uint *)this_01);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_858);
  if (!bVar2) {
    testing::Message::Message(&local_860);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2693f6);
    testing::internal::AssertHelper::AssertHelper
              (&local_868,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2b6,pcVar3);
    testing::internal::AssertHelper::operator=(&local_868,&local_860);
    testing::internal::AssertHelper::~AssertHelper(&local_868);
    testing::Message::~Message((Message *)0x269459);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2694b1);
  cfd::core::Script::GetData(&local_898,&local_e8);
  local_880 = cfd::core::ByteData::GetDataSize(&local_898);
  testing::internal::EqHelper<false>::Compare<unsigned_short,unsigned_long>
            (in_stack_fffffffffffff288,(char *)this_02,(unsigned_short *)lhs,
             (unsigned_long *)this_01);
  cfd::core::ByteData::~ByteData((ByteData *)0x269539);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_878);
  if (!bVar2) {
    testing::Message::Message(&local_8a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2695ce);
    testing::internal::AssertHelper::AssertHelper
              (&local_8a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2b7,pcVar3);
    testing::internal::AssertHelper::operator=(&local_8a8,&local_8a0);
    testing::internal::AssertHelper::~AssertHelper(&local_8a8);
    testing::Message::~Message((Message *)0x269631);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x269686);
  local_8ba = 4;
  testing::internal::EqHelper<false>::Compare<unsigned_short,unsigned_short>
            (in_stack_fffffffffffff288,(char *)this_02,(unsigned_short *)lhs,
             (unsigned_short *)this_01);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_8b8);
  if (!bVar2) {
    testing::Message::Message(&local_8c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x26972c);
    testing::internal::AssertHelper::AssertHelper
              (&local_8d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2b8,pcVar3);
    testing::internal::AssertHelper::operator=(&local_8d0,&local_8c8);
    testing::internal::AssertHelper::~AssertHelper(&local_8d0);
    testing::Message::~Message((Message *)0x26978f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2697e4);
  local_8e2 = 0x6d;
  testing::internal::EqHelper<false>::Compare<unsigned_short,unsigned_short>
            (in_stack_fffffffffffff288,(char *)this_02,(unsigned_short *)lhs,
             (unsigned_short *)this_01);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_8e0);
  if (!bVar2) {
    testing::Message::Message(&local_8f0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x26988a);
    testing::internal::AssertHelper::AssertHelper
              (&local_8f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2b9,pcVar3);
    testing::internal::AssertHelper::operator=(&local_8f8,&local_8f0);
    testing::internal::AssertHelper::~AssertHelper(&local_8f8);
    testing::Message::~Message((Message *)0x2698ed);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x269942);
  local_90a = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_short,unsigned_short>
            (in_stack_fffffffffffff288,(char *)this_02,(unsigned_short *)lhs,
             (unsigned_short *)this_01);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_908);
  if (!bVar2) {
    testing::Message::Message(&local_918);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2699e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_920,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2ba,pcVar3);
    testing::internal::AssertHelper::operator=(&local_920,&local_918);
    testing::internal::AssertHelper::~AssertHelper(&local_920);
    testing::Message::~Message((Message *)0x269a4b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x269aa3);
  local_938 = cfd::core::Amount::GetSatoshiValue(&local_148);
  testing::internal::EqHelper<false>::Compare<unsigned_long,long>
            (in_stack_fffffffffffff288,(char *)this_02,(unsigned_long *)lhs,(long *)this_01);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_930);
  if (!bVar2) {
    testing::Message::Message(&local_940);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x269b70);
    testing::internal::AssertHelper::AssertHelper
              (&local_948,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,699,pcVar3);
    testing::internal::AssertHelper::operator=(&local_948,&local_940);
    testing::internal::AssertHelper::~AssertHelper(&local_948);
    testing::Message::~Message((Message *)0x269bcd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x269c22);
  testing::internal::EqHelper<false>::Compare<void*,void*>
            (in_stack_fffffffffffff288,(char *)this_02,&lhs->_vptr_Script,&this_01->_vptr_Script);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_958);
  if (!bVar2) {
    testing::Message::Message(&local_960);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x269cb8);
    testing::internal::AssertHelper::AssertHelper
              (&local_968,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,700,pcVar3);
    testing::internal::AssertHelper::operator=(&local_968,&local_960);
    testing::internal::AssertHelper::~AssertHelper(&local_968);
    testing::Message::~Message((Message *)0x269d15);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x269d6d);
  __arr = (uchar (*) [33])((long)&uStack_1b0 + 1);
  this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
            std::begin<unsigned_char,33ul>(__arr);
  std::end<unsigned_char,33ul>(__arr);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x269da5);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
            (this_00,*__arr,in_stack_fffffffffffff2a0,
             (allocator_type *)CONCAT17(in_stack_fffffffffffff29f,in_stack_fffffffffffff298));
  cfd::core::ByteData::ByteData(&local_9d8,&local_9f0);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_9c0,&local_9d8);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_998,&local_9c0);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_a18,(ConfidentialAssetId *)&local_5e8);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_978,
             "ConfidentialAssetId(ByteData(std::vector<uint8_t>(std::begin(utxo.asset), std::end(utxo.asset)))).GetHex().c_str()"
             ,"asset.GetHex().c_str()",pcVar3,pcVar4);
  std::__cxx11::string::~string((string *)&local_a18);
  std::__cxx11::string::~string((string *)&local_998);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x269e8a);
  cfd::core::ByteData::~ByteData((ByteData *)0x269e97);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_02);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x269eb1);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_978);
  if (!bVar2) {
    testing::Message::Message(&local_a20);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x269ff8);
    testing::internal::AssertHelper::AssertHelper
              (&local_a28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2bd,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a28,&local_a20);
    testing::internal::AssertHelper::~AssertHelper(&local_a28);
    testing::Message::~Message((Message *)0x26a055);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x26a0aa);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x26a0b7);
  std::__cxx11::string::~string(local_130);
  cfd::core::Script::~Script(this_01);
  cfd::core::Txid::~Txid((Txid *)0x26a0de);
  cfd::core::BlockHash::~BlockHash((BlockHash *)0x26a0eb);
  return;
}

Assistant:

TEST(CoinSelection, ConvertToUtxo)
{
  uint64_t block_height = 1;
  BlockHash block_hash("1234567890123456789012345678901234567890123456789012345678901456");
  Txid txid("0034567890123456789012345678901234567890123456789012345678901456");
  uint32_t vout = 2;
  Script locking_script("0014c59664568fad58004e1fac1b275826d8b525e935");
  std::string output_descriptor("wpkh([ef735203/0'/0'/7']022c2409fbf657ba25d97bb3dab5426d20677b774d4fc7bd3bfac27ff96ada3dd1)");
  Amount amount = Amount::CreateBySatoshiAmount(20000);
  void* binary_data = &vout;
  Utxo utxo = {};
  // std::vector<uint8_t> script_bytes;

  try {
    CoinSelection::ConvertToUtxo(
      block_height, block_hash, txid, vout, locking_script,
      output_descriptor, amount, binary_data, &utxo);
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }
  EXPECT_NO_THROW((CoinSelection::ConvertToUtxo(
    block_height, block_hash, txid, vout, locking_script,
    output_descriptor, amount, binary_data, &utxo)));

  if (utxo.script_length != 0) {
    // script_bytes.resize(utxo.script_length);
    // memcpy(script_bytes.data(), utxo.locking_script, utxo.script_length);
    EXPECT_STREQ(ByteData(std::vector<uint8_t>(std::begin(utxo.locking_script), std::begin(utxo.locking_script) + utxo.script_length)).GetHex().c_str(), locking_script.GetHex().c_str());
  }
  EXPECT_EQ(utxo.block_height, block_height);
  EXPECT_STREQ(BlockHash(ByteData256(std::vector<uint8_t>(std::begin(utxo.block_hash), std::end(utxo.block_hash)))).GetHex().c_str(), block_hash.GetHex().c_str());
  EXPECT_STREQ(Txid(ByteData256(std::vector<uint8_t>(std::begin(utxo.txid), std::end(utxo.txid)))).GetHex().c_str(), txid.GetHex().c_str());
  EXPECT_EQ(utxo.vout, vout);
  EXPECT_EQ(utxo.script_length, locking_script.GetData().GetDataSize());
  EXPECT_EQ(utxo.address_type, static_cast<uint16_t>(AddressType::kP2wpkhAddress));
  EXPECT_EQ(utxo.witness_size_max, static_cast<uint16_t>(109));
  EXPECT_EQ(utxo.uscript_size_max, static_cast<uint16_t>(0));
  EXPECT_EQ(utxo.amount, amount.GetSatoshiValue());
  EXPECT_EQ(utxo.binary_data, binary_data);

#ifndef CFD_DISABLE_ELEMENTS
  ConfidentialAssetId asset("9934567890123456789012345678901234567890123456789012345678901456");
  memset(&utxo, 0, sizeof(utxo));
  EXPECT_NO_THROW((CoinSelection::ConvertToUtxo(
    block_height, block_hash, txid, vout, locking_script,
    output_descriptor, amount, asset, binary_data, &utxo)));

  if (utxo.script_length != 0) {
    // script_bytes.resize(utxo.script_length);
    // memcpy(script_bytes.data(), utxo.locking_script, utxo.script_length);
    EXPECT_STREQ(ByteData(std::vector<uint8_t>(std::begin(utxo.locking_script), std::begin(utxo.locking_script) + utxo.script_length)).GetHex().c_str(), locking_script.GetHex().c_str());
  }
  EXPECT_EQ(utxo.block_height, block_height);
  EXPECT_STREQ(BlockHash(ByteData256(std::vector<uint8_t>(std::begin(utxo.block_hash), std::end(utxo.block_hash)))).GetHex().c_str(), block_hash.GetHex().c_str());
  EXPECT_STREQ(Txid(ByteData256(std::vector<uint8_t>(std::begin(utxo.txid), std::end(utxo.txid)))).GetHex().c_str(), txid.GetHex().c_str());
  EXPECT_EQ(utxo.vout, vout);
  EXPECT_EQ(utxo.script_length, locking_script.GetData().GetDataSize());
  EXPECT_EQ(utxo.address_type, static_cast<uint16_t>(AddressType::kP2wpkhAddress));
  EXPECT_EQ(utxo.witness_size_max, static_cast<uint16_t>(109));
  EXPECT_EQ(utxo.uscript_size_max, static_cast<uint16_t>(0));
  EXPECT_EQ(utxo.amount, amount.GetSatoshiValue());
  EXPECT_EQ(utxo.binary_data, binary_data);
  EXPECT_STREQ(ConfidentialAssetId(ByteData(std::vector<uint8_t>(std::begin(utxo.asset), std::end(utxo.asset)))).GetHex().c_str(), asset.GetHex().c_str());
#endif                // CFD_DISABLE_ELEMENTS
}